

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

float32_t bf_get_float32_be(bfile_t *bfile)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  bfile_t *in_RDI;
  anon_union_4_2_d8cf4852 data;
  undefined4 local_c;
  
  uVar1 = bf_get_uint8(in_RDI);
  uVar2 = bf_get_uint8(in_RDI);
  uVar3 = bf_get_uint8(in_RDI);
  uVar4 = bf_get_uint8(in_RDI);
  local_c = (float32_t)CONCAT31(CONCAT21(CONCAT11(uVar1,uVar2),uVar3),uVar4);
  return local_c;
}

Assistant:

float32_t
bf_get_float32_be(
    bfile_t * bfile )
{
    union {
        float32_t  real;
        uint8_t    bytes[4];
    } data;

#ifndef WORDS_BIGENDIAN
    data.bytes[3] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[0] = bf_get_uint8( bfile );
#else /* WORDS_BIGENDIAN */
    data.bytes[0] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[3] = bf_get_uint8( bfile );
#endif /* WORDS_BIGENDIAN */

    return data.real;
}